

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessBr
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  char cVar1;
  ErrorCode EVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined4 uVar5;
  size_type sVar6;
  pointer pBVar7;
  value_t vVar8;
  json_value jVar9;
  Status SVar10;
  __type _Var11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  reference aJson;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  Value *pVVar17;
  pointer pBVar18;
  int *piVar19;
  event_base *event_base;
  event *ev;
  event *ev_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ssize_t sVar21;
  char *pcVar22;
  pointer pbVar23;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var24;
  pointer pbVar25;
  event_base **__args;
  __normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
  _Var26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  _Alloc_hider _Var28;
  Interpreter *pIVar29;
  undefined1 *puVar30;
  json_value *this_01;
  uchar *puVar31;
  undefined8 uVar32;
  Interpreter *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar33;
  long lVar34;
  uchar *puVar35;
  undefined1 *puVar36;
  long lVar37;
  undefined1 auVar38 [8];
  __normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
  __it;
  string *psVar39;
  string *psVar40;
  pointer pBVar41;
  bool bVar42;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  format_args args_15;
  format_args args_16;
  format_args args_17;
  format_args args_18;
  format_args args_19;
  format_args args_20;
  format_args args_21;
  format_args args_22;
  format_args args_23;
  format_args args_24;
  format_args args_25;
  StringArray unresolved;
  json ba_2;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  networks;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  iterator __end5;
  thread selectThread;
  vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_> agents;
  uint32_t scanTimeout;
  json json;
  json json_1;
  json baJson;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  domNetworks;
  undefined1 local_4888 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_4880;
  undefined1 local_4878 [32];
  undefined1 local_4858 [8];
  json_value jStack_4850;
  undefined1 local_4848 [8];
  undefined1 auStack_4840 [24];
  code *local_4828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4820;
  Interpreter *local_4810;
  string local_4808;
  pointer local_47e0;
  string local_47d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_47b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_47a8;
  pointer local_4798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4790;
  vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_> local_4788;
  uint local_476c;
  undefined1 local_4768 [8];
  json_value jStack_4760;
  pointer local_4758;
  undefined1 local_4740 [16];
  undefined1 local_4730 [8];
  json_value local_4728;
  json_value local_4720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4710 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_46f0 [2];
  undefined1 local_46e0 [8];
  json_value local_46d8;
  undefined4 local_46d0;
  undefined1 *local_46c8;
  long local_46c0;
  undefined1 local_46b8 [16];
  undefined1 local_46a8 [48];
  undefined1 local_4678 [16];
  string local_4668;
  string local_4648;
  undefined1 local_4628 [16];
  undefined4 local_4618;
  char *local_4610;
  long local_4608;
  char local_4600 [16];
  undefined4 local_45f0;
  uchar *local_45e8;
  long local_45e0;
  uchar local_45d8 [16];
  undefined4 local_45c8;
  uchar *local_45c0;
  long local_45b8;
  uchar local_45b0 [16];
  undefined4 local_45a0;
  uchar *local_4598;
  long local_4590;
  uchar local_4588 [16];
  undefined4 local_4578;
  uchar *local_4570;
  long local_4568;
  uchar local_4560 [16];
  undefined4 local_4550;
  char *local_4548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4540;
  undefined4 local_4528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4520;
  undefined1 local_4510 [16];
  undefined4 local_4500;
  undefined1 *local_44f8;
  long local_44f0;
  undefined1 local_44e8 [16];
  undefined4 local_44d8;
  undefined1 *local_44d0;
  long local_44c8;
  undefined1 local_44c0 [16];
  undefined4 local_44b0;
  undefined1 *local_44a8;
  long local_44a0;
  undefined1 local_4498 [16];
  undefined4 local_4488;
  undefined1 *local_4480;
  long local_4478;
  undefined1 local_4470 [16];
  undefined4 local_4460;
  undefined1 *local_4458;
  long local_4450;
  undefined1 local_4448 [16];
  undefined4 local_4438;
  undefined1 *local_4430;
  long local_4428;
  undefined1 local_4420 [16];
  undefined4 local_4410;
  undefined1 *local_4408;
  long local_4400;
  undefined1 local_43f8 [16];
  undefined4 local_43e8;
  undefined1 *local_43e0;
  long local_43d8;
  undefined1 local_43d0 [56];
  undefined4 local_4398;
  char *local_4390;
  long local_4388;
  char local_4380 [16];
  undefined4 local_4370;
  undefined1 *local_4368;
  long local_4360;
  undefined1 local_4358 [16];
  undefined4 local_4348;
  undefined1 *local_4340;
  long local_4338;
  undefined1 local_4330 [16];
  undefined4 local_4320;
  undefined1 *local_4318;
  long local_4310;
  undefined1 local_4308 [16];
  undefined4 local_42f8;
  undefined1 *local_42f0;
  long local_42e8;
  undefined1 local_42e0 [16];
  undefined4 local_42d0;
  undefined1 *local_42c8;
  long local_42c0;
  undefined1 local_42b8 [136];
  undefined4 local_4230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4228;
  long local_4220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4218;
  undefined4 local_4208;
  undefined1 *local_4200;
  long local_41f8;
  undefined1 local_41f0 [16];
  undefined4 local_41e0;
  undefined1 *local_41d8;
  long local_41d0;
  undefined1 local_41c8 [16];
  undefined4 local_41b8;
  undefined1 *local_41b0;
  long local_41a8;
  undefined1 local_41a0 [16];
  undefined4 local_4190;
  undefined1 *local_4188;
  long local_4180;
  undefined1 local_4178 [16];
  undefined4 local_4168;
  undefined1 *local_4160;
  long local_4158;
  undefined1 local_4150 [16];
  undefined4 local_4140;
  undefined1 *local_4138;
  long local_4130;
  undefined1 local_4128 [16];
  _Any_data local_4118;
  code *local_4108;
  undefined8 uStack_4100;
  string local_40f0;
  Error local_40d0;
  string_t local_40a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_4088;
  string local_4078;
  string_t local_4058;
  undefined1 local_4038 [8];
  _Alloc_hider _Stack_4030;
  undefined1 local_4028 [24];
  _Alloc_hider local_4010;
  pointer local_4008;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4000 [1021];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_47e0 = (pointer)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  psVar39 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar23 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23) < 0x21) {
    local_4858 = (undefined1  [8])((ulong)local_4858 & 0xffffffff00000000);
    jStack_4850.object = (object_t *)0x2635f1;
    local_4848 = (undefined1  [8])0x11;
    auStack_4840._0_8_ = 0;
    auStack_4840._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    pcVar22 = "too few arguments";
    auStack_4840._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_4858;
    do {
      pcVar14 = pcVar22 + 1;
      if (*pcVar22 == '}') {
        if ((pcVar14 == "") || (*pcVar14 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar14 = pcVar22 + 2;
      }
      else if (*pcVar22 == '{') {
        pcVar14 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar22,"",(format_string_checker<char> *)local_4858);
      }
      pcVar22 = pcVar14;
    } while (pcVar14 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_4858;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_4888,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_4140 = 2;
    local_4138 = local_4128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4138,local_4888,(char *)((long)local_4888 + (long)paStack_4880));
    local_4038._0_4_ = local_4140;
    _Stack_4030._M_p = (pointer)(local_4028 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_4030,local_4138,local_4138 + local_4130);
    local_4008 = (pointer)0x0;
    local_4000[0]._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
    local_4010._M_p = (pointer)local_4000;
    std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
    std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4010._M_p != local_4000) {
      operator_delete(local_4010._M_p);
    }
    if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
      operator_delete(_Stack_4030._M_p);
    }
    if (local_4138 != local_4128) {
      operator_delete(local_4138);
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4878;
    _Var28._M_p = (pointer)local_4888;
  }
  else {
    local_4888 = (undefined1  [8])local_4878;
    paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x4;
    local_4878._0_5_ = 0x7473696c;
    utils::ToLower((string *)local_4038,pbVar23 + 1);
    utils::ToLower((string *)local_4858,(string *)local_4888);
    auVar38 = local_4858;
    local_4810 = this;
    if ((object_t *)_Stack_4030._M_p == jStack_4850.object) {
      if ((pointer)_Stack_4030._M_p == (pointer)0x0) {
        bVar42 = true;
      }
      else {
        iVar12 = bcmp((void *)local_4038,(void *)local_4858,(size_t)_Stack_4030._M_p);
        bVar42 = iVar12 == 0;
      }
    }
    else {
      bVar42 = false;
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4848;
    if (auVar38 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar38);
    }
    if (local_4038 != (undefined1  [8])local_4028) {
      operator_delete((void *)local_4038);
    }
    if (local_4888 != (undefined1  [8])local_4878) {
      operator_delete((void *)local_4888);
    }
    if (bVar42) {
      local_4768 = (undefined1  [8])((ulong)local_4768 & 0xffffffffffffff00);
      jStack_4760.object = (object_t *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_4768);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_4768);
      local_47d8.field_2._M_allocated_capacity = 0;
      local_47d8._M_dataplus._M_p = (pointer)0x0;
      local_47d8._M_string_length = 0;
      local_4808.field_2._M_allocated_capacity = 0;
      local_4808._M_dataplus._M_p = (pointer)0x0;
      local_4808._M_string_length = 0;
      if ((long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        pbVar23 = (local_4810->mContext).mDomAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar25 = (local_4810->mContext).mDomAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar25 == pbVar23) {
          if ((local_4810->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (local_4810->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4888 = (undefined1  [8])0x0;
            paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
            local_4878._0_8_ = 0;
            SVar10 = persistent_storage::Registry::GetNetworksByAliases
                               ((local_4810->mRegistry).
                                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,(StringArray *)local_4810,(NetworkArray *)&local_4808,
                                (StringArray *)local_4888);
            if (SVar10 != kSuccess) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)&local_47b8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4858,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),
                         args_01);
              local_4190 = 0x12;
              local_4188 = local_4178;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4188,local_4858,
                         (char *)((long)local_4858 + (long)jStack_4850));
              local_4038._0_4_ = local_4190;
              _Stack_4030._M_p = local_4028 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4030,local_4188,local_4188 + local_4180);
              local_4010._M_p = (pointer)local_4000;
              local_4008 = (pointer)0x0;
              local_4000[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4038);
              Value::~Value((Value *)local_4038);
              if (local_4188 != local_4178) {
                operator_delete(local_4188);
              }
              if (local_4858 != (undefined1  [8])paVar20) {
                operator_delete((void *)local_4858);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4888);
              goto LAB_001b2b78;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4888);
            goto LAB_001b2720;
          }
          SVar10 = persistent_storage::Registry::GetAllBorderRouters
                             ((local_4810->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(BorderRouterArray *)&local_47d8);
          if (SVar10 < kDataInvalid) goto LAB_001b2720;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_05.field_1.args_ = in_R9.args_;
          args_05.desc_ = (unsigned_long_long)local_4888;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_4858,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_05);
          local_41b8 = 0x12;
          local_41b0 = local_41a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_41b0,local_4858,(char *)((long)local_4858 + (long)jStack_4850)
                    );
          local_4038._0_4_ = local_41b8;
          _Stack_4030._M_p = local_4028 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&_Stack_4030,local_41b0,local_41b0 + local_41a8);
          local_4010._M_p = (pointer)local_4000;
          local_4008 = (pointer)0x0;
          local_4000[0]._M_local_buf[0] = '\0';
          Value::operator=(__return_storage_ptr__,(Value *)local_4038);
          Value::~Value((Value *)local_4038);
          local_4058._M_dataplus._M_p = (pointer)local_4858;
          if (local_41b0 != local_41a0) {
            operator_delete(local_41b0);
            local_4058._M_dataplus._M_p = (pointer)local_4858;
          }
        }
        else {
          do {
            local_4038 = (undefined1  [8])0x0;
            _Stack_4030._M_p = (pointer)0x0;
            local_4028._0_8_ = 0;
            SVar10 = persistent_storage::Registry::GetNetworksInDomain
                               ((local_4810->mRegistry).
                                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,pbVar23,
                                (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                 *)local_4038);
            if (SVar10 == kSuccess) {
              std::
              vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
              ::
              _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>>
                        ((vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
                          *)&local_4808,local_4808._M_string_length,local_4038,_Stack_4030._M_p);
            }
            else {
              local_4648._M_dataplus._M_p = (pointer)&local_4648.field_2;
              pcVar3 = (pbVar23->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4648,pcVar3,pcVar3 + pbVar23->_M_string_length);
              local_4858 = (undefined1  [8])0x13;
              paVar20 = &local_4700;
              local_4700._M_allocated_capacity = (size_type)local_46f0;
              local_4700._M_allocated_capacity =
                   std::__cxx11::string::_M_create
                             (&local_4700._M_allocated_capacity,(ulong)local_4858);
              local_46f0[0] =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_4858;
              *(undefined8 *)local_4700._M_allocated_capacity = 0x6e206e69616d6f64;
              *(undefined8 *)(local_4700._M_allocated_capacity + 8) = 0x6e6b6e7520656d61;
              builtin_strncpy((char *)(local_4700._M_allocated_capacity + 0xf),"nown",4);
              local_4700._8_8_ = local_4858;
              *(char *)(local_4700._M_allocated_capacity + (long)local_4858) = '\0';
              PrintNetworkMessage((Interpreter *)paVar20,&local_4648,(string *)&local_4700,kYellow);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_4700._M_allocated_capacity != local_46f0) {
                operator_delete((void *)local_4700._M_allocated_capacity);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4648._M_dataplus._M_p != &local_4648.field_2) {
                operator_delete(local_4648._M_dataplus._M_p);
              }
            }
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       *)local_4038);
            pbVar23 = pbVar23 + 1;
          } while (pbVar23 != pbVar25);
LAB_001b2720:
          sVar6 = local_4808._M_string_length;
          if ((pointer)local_4808._M_string_length != local_4808._M_dataplus._M_p) {
            _Var28._M_p = local_4808._M_dataplus._M_p;
            do {
              local_4038 = (undefined1  [8])0x0;
              _Stack_4030._M_p = (pointer)0x0;
              local_4028._0_8_ = 0;
              pIVar29 = (Interpreter *)
                        (local_4810->mRegistry).
                        super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              SVar10 = persistent_storage::Registry::GetBorderRoutersInNetwork
                                 ((Registry *)pIVar29,*(uint64_t *)(_Var28._M_p + 0x28),
                                  (vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                   *)local_4038);
              if (SVar10 == kSuccess) {
                std::
                vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>
                ::
                _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>>
                          ((vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>
                            *)&local_47d8,local_47d8._M_string_length,local_4038,_Stack_4030._M_p);
              }
              else {
                local_4668.field_2._8_5_ = 0x64656c6961;
                local_4668.field_2._M_allocated_capacity._0_5_ = 0x756b6f6f6c;
                local_4668.field_2._M_allocated_capacity._5_3_ = 0x662070;
                local_4668._M_string_length = 0xd;
                local_4668.field_2._M_local_buf[0xd] = '\0';
                local_4668._M_dataplus._M_p = (pointer)((long)&local_4668 + 0x10U);
                PrintNetworkMessage(pIVar29,*(uint64_t *)(_Var28._M_p + 0x28),
                                    (string *)(local_46a8 + 0x40),kYellow);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4668._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)&local_4668 + 0x10U)) {
                  operator_delete(local_4668._M_dataplus._M_p);
                }
              }
              std::
              vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                         *)local_4038);
              _Var28._M_p = _Var28._M_p + 0x60;
            } while (_Var28._M_p != (pointer)sVar6);
          }
          if ((pointer)local_47d8._M_string_length != local_47d8._M_dataplus._M_p) {
            local_46d8.object = (object_t *)0x0;
            local_46e0[0] = 2;
            local_4038 = (undefined1  [8])local_47d8._M_dataplus._M_p;
            local_4858 = (undefined1  [8])local_47d8._M_string_length;
            local_46d8.object =
                 (object_t *)
                 nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::
                 create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_const*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_const*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>>
                           ((__normal_iterator<const_ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                             *)local_4038,
                            (__normal_iterator<const_ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                             *)local_4858);
            this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)(local_46f0 + 2);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(this_00);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(this_00);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(this_00);
            jVar9 = jStack_4760;
            vVar8 = local_4768[0];
            local_4768[0] = local_46e0[0];
            local_46e0[0] = vVar8;
            jStack_4760.string = local_46d8.string;
            local_46d8 = jVar9;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_4768);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(this_00);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_46f0 + 3),local_46e0[0]);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_4058,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_4768,4,' ',false,strict);
            Value::Value((Value *)local_4038,&local_4058);
            (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
            std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
            std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4010._M_p != local_4000) {
              operator_delete(local_4010._M_p);
            }
            if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
              operator_delete(_Stack_4030._M_p);
            }
            paVar20 = &local_4058.field_2;
            goto LAB_001b2b6e;
          }
          paVar20 = &local_4078.field_2;
          local_4078.field_2._M_allocated_capacity._0_2_ = 0x5d5b;
          local_4078._M_string_length = 2;
          local_4078.field_2._M_local_buf[2] = '\0';
          local_4078._M_dataplus._M_p = (pointer)paVar20;
          Value::Value((Value *)local_4038,&local_4078);
          (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
          std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
          std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4010._M_p != local_4000) {
            operator_delete(local_4010._M_p);
          }
          local_4058._M_dataplus._M_p = local_4078._M_dataplus._M_p;
          if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
            operator_delete(_Stack_4030._M_p);
            local_4058._M_dataplus._M_p = local_4078._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4058._M_dataplus._M_p == paVar20) goto LAB_001b2b78;
      }
      else {
        local_4858 = (undefined1  [8])((ulong)local_4858 & 0xffffffff00000000);
        jStack_4850.object = (object_t *)0x264000;
        local_4848 = (undefined1  [8])0x12;
        auStack_4840._0_8_ = 0;
        auStack_4840._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pcVar22 = "too many arguments";
        auStack_4840._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4858;
        do {
          pcVar14 = pcVar22 + 1;
          if (*pcVar22 == '}') {
            if ((pcVar14 == "") || (*pcVar14 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar14 = pcVar22 + 2;
          }
          else if (*pcVar22 == '{') {
            pcVar14 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar22,"",(format_string_checker<char> *)local_4858);
          }
          pcVar22 = pcVar14;
        } while (pcVar14 != "");
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_4858;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_4888,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),
                   args_00);
        local_4168 = 2;
        local_4160 = local_4150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4160,local_4888,
                   (char *)((long)local_4888 + (long)(_Alloc_hider *)paStack_4880));
        local_4038._0_4_ = local_4168;
        _Stack_4030._M_p = (pointer)(local_4028 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&_Stack_4030,local_4160,local_4160 + local_4158);
        local_4008 = (pointer)0x0;
        local_4000[0]._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
        local_4010._M_p = (pointer)local_4000;
        std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
        std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4010._M_p != local_4000) {
          operator_delete(local_4010._M_p);
        }
        if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
          operator_delete(_Stack_4030._M_p);
        }
        if (local_4160 != local_4150) {
          operator_delete(local_4160);
        }
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4878;
        local_4058._M_dataplus._M_p = (pointer)local_4888;
LAB_001b2b6e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4058._M_dataplus._M_p == paVar20) goto LAB_001b2b78;
      }
      operator_delete(local_4058._M_dataplus._M_p);
LAB_001b2b78:
      std::
      vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 *)&local_4808);
      std::
      vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 *)&local_47d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_4768);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_4768 + 8),local_4768[0]);
      return __return_storage_ptr__;
    }
    local_4888 = (undefined1  [8])local_4878;
    local_4878._0_4_ = 0x646461;
    paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x3;
    utils::ToLower((string *)local_4038,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
    utils::ToLower((string *)local_4858,(string *)local_4888);
    auVar38 = local_4858;
    if ((object_t *)_Stack_4030._M_p == jStack_4850.object) {
      if ((pointer)_Stack_4030._M_p == (pointer)0x0) {
        bVar42 = true;
      }
      else {
        iVar12 = bcmp((void *)local_4038,(void *)local_4858,(size_t)_Stack_4030._M_p);
        bVar42 = iVar12 == 0;
      }
    }
    else {
      bVar42 = false;
    }
    if (auVar38 != (undefined1  [8])paVar20) {
      operator_delete((void *)auVar38);
    }
    if (local_4038 != (undefined1  [8])local_4028) {
      operator_delete((void *)local_4038);
    }
    if (local_4888 != (undefined1  [8])local_4878) {
      operator_delete((void *)local_4888);
    }
    if (!bVar42) {
      local_4888 = (undefined1  [8])local_4878;
      paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x6;
      local_4878._0_7_ = 0x6574656c6564;
      utils::ToLower((string *)local_4038,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1);
      utils::ToLower((string *)local_4858,(string *)local_4888);
      auVar38 = local_4858;
      if ((object_t *)_Stack_4030._M_p == jStack_4850.object) {
        if ((pointer)_Stack_4030._M_p == (pointer)0x0) {
          bVar42 = true;
        }
        else {
          iVar12 = bcmp((void *)local_4038,(void *)local_4858,(size_t)_Stack_4030._M_p);
          bVar42 = iVar12 == 0;
        }
      }
      else {
        bVar42 = false;
      }
      if (auVar38 != (undefined1  [8])paVar20) {
        operator_delete((void *)auVar38);
      }
      if (local_4038 != (undefined1  [8])local_4028) {
        operator_delete((void *)local_4038);
      }
      if (local_4888 != (undefined1  [8])local_4878) {
        operator_delete((void *)local_4888);
      }
      pIVar29 = local_4810;
      if (bVar42) {
        uVar15 = (long)(aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
        if (uVar15 < 0x61) {
          if (uVar15 != 0x60) {
            if ((local_4810->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                (local_4810->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              psVar39 = (local_4810->mContext).mDomAliases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((local_4810->mContext).mDomAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == psVar39) {
                return __return_storage_ptr__;
              }
              local_4888 = (undefined1  [8])0x0;
              paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x0;
              local_4878._0_8_ = 0;
              SVar10 = persistent_storage::Registry::DeleteBorderRoutersInDomain
                                 ((local_4810->mRegistry).
                                  super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,psVar39);
              if (SVar10 != kSuccess) {
                if (SVar10 == kRestricted) {
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  pbVar23 = (pIVar29->mContext).mDomAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_47d8._M_dataplus._M_p = (pbVar23->_M_dataplus)._M_p;
                  local_47d8._M_string_length = pbVar23->_M_string_length;
                  fmt_00.size_ = 0xd;
                  fmt_00.data_ = (char *)0x49;
                  args_09.field_1.values_ = in_R9.values_;
                  args_09.desc_ = (unsigned_long_long)&local_47d8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_4858,
                             (v10 *)
                             "Failed to delete border routers in the domain \'{}\' of the current network"
                             ,fmt_00,args_09);
                  local_4488 = 0x12;
                  puVar36 = local_4470;
                  local_4480 = puVar36;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4480,local_4858,
                             (char *)((long)local_4858 + (long)jStack_4850));
                  local_4038._0_4_ = local_4488;
                  _Stack_4030._M_p = local_4028 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&_Stack_4030,local_4480,local_4480 + local_4478);
                  local_4010._M_p = (pointer)local_4000;
                  local_4008 = (pointer)0x0;
                  local_4000[0]._M_local_buf[0] = '\0';
                  Value::operator=(__return_storage_ptr__,(Value *)local_4038);
                  Value::~Value((Value *)local_4038);
                  puVar30 = local_4480;
                }
                else {
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  pbVar23 = (pIVar29->mContext).mDomAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_47d8._M_dataplus._M_p = (pbVar23->_M_dataplus)._M_p;
                  local_47d8._M_string_length = pbVar23->_M_string_length;
                  fmt_06.size_ = 0xd;
                  fmt_06.data_ = (char *)0x32;
                  args_19.field_1.values_ = in_R9.values_;
                  args_19.desc_ = (unsigned_long_long)&local_47d8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_4858,
                             (v10 *)"Failed to delete border routers in the domain \'{}\'",fmt_06,
                             args_19);
                  local_44b0 = 0x12;
                  puVar36 = local_4498;
                  local_44a8 = puVar36;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_44a8,local_4858,
                             (char *)((long)local_4858 + (long)jStack_4850));
                  local_4038._0_4_ = local_44b0;
                  _Stack_4030._M_p = local_4028 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&_Stack_4030,local_44a8,local_44a8 + local_44a0);
                  local_4010._M_p = (pointer)local_4000;
                  local_4008 = (pointer)0x0;
                  local_4000[0]._M_local_buf[0] = '\0';
                  Value::operator=(__return_storage_ptr__,(Value *)local_4038);
                  Value::~Value((Value *)local_4038);
                  puVar30 = local_44a8;
                }
                if (puVar30 != puVar36) {
                  operator_delete(puVar30);
                }
                if (local_4858 != (undefined1  [8])paVar20) {
                  operator_delete((void *)local_4858);
                }
              }
            }
            else {
              local_4888 = (undefined1  [8])0x0;
              paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x0;
              local_4878._0_8_ = 0;
              SVar10 = persistent_storage::Registry::DeleteBorderRoutersInNetworks
                                 ((local_4810->mRegistry).
                                  super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(StringArray *)local_4810,(StringArray *)local_4888);
              if (SVar10 != kSuccess) {
                if (SVar10 == kRestricted) {
                  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                  args_06.field_1.values_ = in_R9.values_;
                  args_06.desc_ = (unsigned_long_long)&local_47d8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_4858,
                             (v10 *)"Can\'t delete all border routers from the current network",
                             (string_view)ZEXT816(0x38),args_06);
                  local_4438 = 0x12;
                  puVar36 = local_4420;
                  local_4430 = puVar36;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4430,local_4858,
                             (char *)((long)local_4858 + (long)jStack_4850));
                  local_4038._0_4_ = local_4438;
                  _Stack_4030._M_p = local_4028 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&_Stack_4030,local_4430,local_4430 + local_4428);
                  local_4010._M_p = (pointer)local_4000;
                  local_4008 = (pointer)0x0;
                  local_4000[0]._M_local_buf[0] = '\0';
                  Value::operator=(__return_storage_ptr__,(Value *)local_4038);
                  Value::~Value((Value *)local_4038);
                  puVar30 = local_4430;
                }
                else {
                  local_4858 = (undefined1  [8])paVar20;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_4858,"Failed to delete border routers","");
                  local_4460 = 0xb;
                  puVar36 = local_4448;
                  local_4458 = puVar36;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4458,local_4858,
                             (char *)((long)local_4858 + (long)jStack_4850));
                  local_4038._0_4_ = local_4460;
                  _Stack_4030._M_p = local_4028 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&_Stack_4030,local_4458,local_4458 + local_4450);
                  local_4010._M_p = (pointer)local_4000;
                  local_4008 = (pointer)0x0;
                  local_4000[0]._M_local_buf[0] = '\0';
                  Value::operator=(__return_storage_ptr__,(Value *)local_4038);
                  Value::~Value((Value *)local_4038);
                  puVar30 = local_4458;
                }
                if (puVar30 != puVar36) {
                  operator_delete(puVar30);
                }
                if (local_4858 != (undefined1  [8])paVar20) {
                  operator_delete((void *)local_4858);
                }
              }
              paVar20 = paStack_4880;
              if (local_4888 != (undefined1  [8])paStack_4880) {
                auVar38 = local_4888;
                do {
                  pcVar3 = (((pointer)auVar38)->_M_dataplus)._M_p;
                  local_40f0._M_dataplus._M_p = (pointer)&local_40f0.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_40f0,pcVar3,
                             pcVar3 + ((pointer)auVar38)->_M_string_length);
                  local_4038 = (undefined1  [8])0x11;
                  this_01 = &local_4720;
                  local_4720.object = (object_t *)local_4710;
                  local_4720.object =
                       (object_t *)
                       std::__cxx11::string::_M_create
                                 (&local_4720.number_unsigned,(ulong)local_4038);
                  local_4710[0] =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_4038;
                  ((local_4720.array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start = 0x742064656c696166;
                  *(undefined8 *)(local_4720.number_integer + 8) = 0x766c6f736572206f;
                  *(undefined1 *)(local_4720.number_integer + 0x10) = 0x65;
                  local_4718 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)local_4038;
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_4038)->_M_local_buf[(long)local_4720.object] = '\0';
                  PrintNetworkMessage((Interpreter *)this_01,&local_40f0,(string *)&local_4720,
                                      kYellow);
                  if (local_4720.object != (object_t *)local_4710) {
                    operator_delete(local_4720.object);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_40f0._M_dataplus._M_p != &local_40f0.field_2) {
                    operator_delete(local_40f0._M_dataplus._M_p);
                  }
                  auVar38 = (undefined1  [8])((long)auVar38 + 0x20);
                } while (auVar38 != (undefined1  [8])paVar20);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4888);
            return __return_storage_ptr__;
          }
          if (((local_4810->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (local_4810->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_4810->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (local_4810->mContext).mDomAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)&local_47d8);
            uVar13 = std::__cxx11::stoi((aExpr->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0
                                        ,10);
            persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)local_4038,uVar13);
            local_47d8._M_dataplus._M_p._0_4_ = local_4038._0_4_;
            SVar10 = persistent_storage::Registry::DeleteBorderRouterById
                               ((pIVar29->mRegistry).
                                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,(BorderRouterId *)&local_47d8);
            if (SVar10 == kSuccess) {
              return __return_storage_ptr__;
            }
            if (SVar10 == kRestricted) {
              ::fmt::v10::detail::
              check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              pbVar23 = (aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_4888 = (undefined1  [8])pbVar23[2]._M_dataplus._M_p;
              paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)pbVar23[2]._M_string_length;
              fmt_02.size_ = 0xd;
              fmt_02.data_ = (char *)0x48;
              args_14.field_1.values_ = in_R9.values_;
              args_14.desc_ = (unsigned_long_long)local_4888;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4858,
                         (v10 *)
                         "Failed to delete border router ID {}: last router in the current network",
                         fmt_02,args_14);
              local_43e8 = 0x12;
              puVar36 = local_43d0;
              local_43e0 = puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_43e0,local_4858,
                         (char *)((long)local_4858 + (long)jStack_4850));
              local_4038._0_4_ = local_43e8;
              _Stack_4030._M_p = local_4028 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4030,local_43e0,local_43e0 + local_43d8);
              local_4010._M_p = (pointer)local_4000;
              local_4008 = (pointer)0x0;
              local_4000[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4038);
              Value::~Value((Value *)local_4038);
              puVar30 = local_43e0;
            }
            else {
              ::fmt::v10::detail::
              check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              pbVar23 = (aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_4888 = (undefined1  [8])pbVar23[2]._M_dataplus._M_p;
              paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)pbVar23[2]._M_string_length;
              fmt_08.size_ = 0xd;
              fmt_08.data_ = (char *)0x24;
              args_22.field_1.values_ = in_R9.values_;
              args_22.desc_ = (unsigned_long_long)local_4888;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4858,(v10 *)"Failed to delete border router ID {}",fmt_08,
                         args_22);
              local_4410 = 0x12;
              puVar36 = local_43f8;
              local_4408 = puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4408,local_4858,
                         (char *)((long)local_4858 + (long)jStack_4850));
              local_4038._0_4_ = local_4410;
              _Stack_4030._M_p = local_4028 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4030,local_4408,local_4408 + local_4400);
              local_4010._M_p = (pointer)local_4000;
              local_4008 = (pointer)0x0;
              local_4000[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4038);
              Value::~Value((Value *)local_4038);
              puVar30 = local_4408;
            }
            if (puVar30 != puVar36) {
              operator_delete(puVar30);
            }
            _Var28._M_p = (pointer)local_4858;
            if (local_4858 == (undefined1  [8])paVar20) {
              return __return_storage_ptr__;
            }
            goto LAB_001b2506;
          }
        }
        local_4858 = (undefined1  [8])((ulong)local_4858 & 0xffffffff00000000);
        pcVar22 = "Too many arguments for `br delete` command`";
        jStack_4850.object = (object_t *)0x26434f;
        local_4848 = (undefined1  [8])0x2b;
        auStack_4840._0_8_ = 0;
        auStack_4840._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        auStack_4840._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4858;
        local_47d8._M_dataplus._M_p = (pointer)local_4858;
        do {
          cVar1 = *pcVar22;
          pcVar14 = pcVar22;
          while (cVar1 != '{') {
            pcVar14 = pcVar14 + 1;
            if (pcVar14 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&local_47d8,pcVar22,"");
              goto LAB_001b34ec;
            }
            cVar1 = *pcVar14;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_47d8,pcVar22,pcVar14);
          pcVar22 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar14,"",(format_string_checker<char> *)local_4858);
        } while (pcVar22 != "");
LAB_001b34ec:
        args_04.field_1.args_ = in_R9.args_;
        args_04.desc_ = (unsigned_long_long)local_4858;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_4888,(v10 *)"Too many arguments for `br delete` command`",
                   (string_view)ZEXT816(0x2b),args_04);
        local_4398 = 2;
        pcVar22 = local_4380;
        local_4390 = pcVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4390,local_4888,(char *)((long)local_4888 + (long)paStack_4880))
        ;
        local_4038._0_4_ = local_4398;
        _Stack_4030._M_p = (pointer)(local_4028 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&_Stack_4030,local_4390,local_4390 + local_4388);
        local_4008 = (pointer)0x0;
        local_4000[0]._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
        local_4010._M_p = (pointer)local_4000;
        std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
        std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4010._M_p != local_4000) {
          operator_delete(local_4010._M_p);
        }
        pcVar14 = local_4390;
        if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
          operator_delete(_Stack_4030._M_p);
          pcVar14 = local_4390;
        }
      }
      else {
        local_4888 = (undefined1  [8])local_4878;
        paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x4;
        local_4878._0_5_ = 0x6e616373;
        utils::ToLower((string *)local_4038,
                       (aExpr->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
        utils::ToLower((string *)local_4858,(string *)local_4888);
        auVar38 = local_4858;
        if ((object_t *)_Stack_4030._M_p == jStack_4850.object) {
          if ((pointer)_Stack_4030._M_p == (pointer)0x0) {
            bVar42 = true;
          }
          else {
            iVar12 = bcmp((void *)local_4038,(void *)local_4858,(size_t)_Stack_4030._M_p);
            bVar42 = iVar12 == 0;
          }
        }
        else {
          bVar42 = false;
        }
        if (auVar38 != (undefined1  [8])paVar20) {
          operator_delete((void *)auVar38);
        }
        if (local_4038 != (undefined1  [8])local_4028) {
          operator_delete((void *)local_4038);
        }
        if (local_4888 != (undefined1  [8])local_4878) {
          operator_delete((void *)local_4888);
        }
        if (bVar42) {
          local_47d8._M_dataplus._M_p = (pointer)&local_47d8.field_2;
          local_4038 = (undefined1  [8])0x13;
          local_47d8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_47d8,(ulong)local_4038);
          local_47d8.field_2._M_allocated_capacity = (size_type)local_4038;
          *(undefined8 *)local_47d8._M_dataplus._M_p = 0x706f636873656d5f;
          (((parse_context_type *)(local_47d8._M_dataplus._M_p + 8))->
          super_basic_format_parse_context<char>).format_str_.data_ = (char *)0x6f6c2e7064755f2e;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_47d8._M_dataplus._M_p + 0xf) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_47d8._M_dataplus._M_p + 0x10) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_47d8._M_dataplus._M_p + 0x11) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_47d8._M_dataplus._M_p + 0x12) = 'l';
          local_47d8._M_string_length = (size_type)local_4038;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_4038)->_M_local_buf[(long)local_47d8._M_dataplus._M_p] = '\0';
          local_476c = 10000;
          local_4808._M_dataplus._M_p = (pointer)&local_4808.field_2;
          local_4808._M_string_length = 0;
          local_4808.field_2._M_allocated_capacity =
               local_4808.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_4790 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
          local_4758 = (pointer)0x0;
          local_4768 = (undefined1  [8])0x0;
          jStack_4760.object = (object_t *)0x0;
          local_4730[0] = null;
          local_4728.object = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_4730);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_4730);
          pIVar29 = local_4810;
          _Var16 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[10]>>
                             ((local_4810->mContext).mCommandKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (local_4810->mContext).mCommandKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,"--timeout");
          pbVar27 = (pIVar29->mContext).mCommandKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (_Var16._M_current == pbVar27) {
LAB_001b40f6:
            _Var16 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                               ((pIVar29->mContext).mCommandKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,pbVar27,"--netif");
            pbVar27 = (pIVar29->mContext).mCommandKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (_Var16._M_current != pbVar27) {
              if (_Var16._M_current + 1 == pbVar27) {
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_13.field_1.args_ = in_R9.args_;
                args_13.desc_ = (unsigned_long_long)&local_47b8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4888,(v10 *)"Missing --netif value",
                           (string_view)ZEXT816(0x15),args_13);
                local_4500 = 2;
                puVar36 = local_44e8;
                local_44f8 = puVar36;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_44f8,local_4888,
                           (char *)((long)local_4888 + (long)paStack_4880));
                local_4858._0_4_ = local_4500;
                jStack_4850.object = (object_t *)(local_4848 + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&jStack_4850,local_44f8,local_44f8 + local_44f0);
                auStack_4840._16_8_ = &local_4820;
                local_4828 = (code *)0x0;
                local_4820._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_4858);
                Value::~Value((Value *)local_4858);
                uVar32 = local_44f8;
                goto LAB_001b459d;
              }
              std::__cxx11::string::_M_assign((string *)&local_4808);
            }
            uVar13 = mdns_socket_open_ipv4();
            if ((int)uVar13 < 0) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_12.field_1.values_ = in_R9.values_;
              args_12.desc_ = (unsigned_long_long)&local_47b8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4888,(v10 *)"failed to open mDNS IPv4 socket",
                         (string_view)ZEXT816(0x1f),args_12);
              local_4528 = 0xb;
              puVar36 = local_4510;
              local_4520._M_allocated_capacity = (size_type)puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4520,local_4888,
                         (char *)((long)local_4888 + (long)paStack_4880));
              local_4858._0_4_ = local_4528;
              jStack_4850.object = (object_t *)(local_4848 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&jStack_4850,local_4520._M_allocated_capacity,
                         (undefined1 *)(local_4520._8_8_ + local_4520._M_allocated_capacity));
              auStack_4840._16_8_ = &local_4820;
              local_4828 = (code *)0x0;
              local_4820._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4858);
              Value::~Value((Value *)local_4858);
              uVar32 = local_4520._M_allocated_capacity;
LAB_001b459d:
              if ((undefined1 *)uVar32 != puVar36) {
                operator_delete((void *)uVar32);
              }
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4878;
              uVar32 = local_4888;
LAB_001b45b1:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar32 != paVar20) {
                operator_delete((void *)uVar32);
              }
              goto LAB_001b45c3;
            }
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_4808._M_string_length !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) &&
               (iVar12 = setsockopt(uVar13,1,0x19,local_4808._M_dataplus._M_p,
                                    (socklen_t)local_4808._M_string_length), iVar12 != 0)) {
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                        ();
              piVar19 = __errno_location();
              local_4878._0_8_ = strerror(*piVar19);
              local_4888 = (undefined1  [8])local_4808._M_dataplus._M_p;
              paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_4808._M_string_length;
              fmt_01.size_ = 0xcd;
              fmt_01.data_ = (char *)0x27;
              args_10.field_1.args_ = in_R9.args_;
              args_10.desc_ = (unsigned_long_long)local_4888;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&local_47b8,(v10 *)"failed to bind network interface {}: {}",
                         fmt_01,args_10);
              local_4550 = 2;
              local_4548 = local_4540._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4548,local_47b8._0_8_,
                         (char *)(local_47b8._8_8_ + local_47b8._0_8_));
              local_4858._0_4_ = local_4550;
              jStack_4850.object = (object_t *)(local_4848 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&jStack_4850,local_4548,
                         local_4548 + local_4540._M_allocated_capacity);
              auStack_4840._16_8_ = &local_4820;
              local_4828 = (code *)0x0;
              local_4820._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4858);
              Value::~Value((Value *)local_4858);
              if (local_4548 != local_4540._M_local_buf + 8) {
                operator_delete(local_4548);
              }
              paVar20 = &aStack_47a8;
              uVar32 = local_47b8._0_8_;
              goto LAB_001b45b1;
            }
            event_base = event_base_new();
            local_4740._0_8_ = (ulong)local_476c / 1000;
            local_4740._8_4_ = (local_476c % 1000) * 1000;
            local_4740._12_4_ = 0;
            event_base_loopexit(event_base,(timeval *)local_4740);
            ev = event_new(event_base,uVar13,0x12,ProcessBr::anon_class_1_0_00000001::__invoke,
                           local_4768);
            event_add(ev,(timeval *)0x0);
            ev_00 = event_new(event_base,pIVar29->mCancelPipe[0],0x12,
                              ProcessBr::anon_class_1_0_00000001::__invoke,event_base);
            event_add(ev_00,(timeval *)0x0);
            std::thread::
            thread<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__35,event_base*&,void>
                      ((thread *)local_4858,(anon_class_1_0_00000001_for__M_head_impl *)event_base,
                       __args);
            if (local_4790 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_001b6410;
            local_4790 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_4858;
            aVar33 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )0x4000;
            iVar12 = mdns_query_send(uVar13,MDNS_RECORDTYPE_PTR,local_47d8._M_dataplus._M_p,
                                     local_47d8._M_string_length,local_4038,0x4000);
            if (iVar12 == 0) {
              std::thread::join();
              if (((local_4810->mCancelCommand)._M_base._M_i & 1U) != 0) {
                do {
                  sVar21 = read(local_4810->mCancelPipe[0],&local_4788,4);
                } while (sVar21 != -1);
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_16.field_1.args_ = aVar33.args_;
                args_16.desc_ = (unsigned_long_long)&local_47b8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4888,(v10 *)"Scan cancelled by user",
                           (string_view)ZEXT816(0x16),args_16);
                local_45a0 = 1;
                puVar35 = local_4588;
                local_4598 = puVar35;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4598,local_4888,
                           (char *)((long)local_4888 + (long)paStack_4880));
                local_4858._0_4_ = local_45a0;
                jStack_4850.object = (object_t *)(local_4848 + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&jStack_4850,local_4598,local_4598 + local_4590);
                auStack_4840._16_8_ = &local_4820;
                local_4828 = (code *)0x0;
                local_4820._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_4858);
                Value::~Value((Value *)local_4858);
                puVar31 = local_4598;
                goto LAB_001b4d31;
              }
              local_47b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_47b8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              aStack_47a8._M_allocated_capacity = 0;
              local_4788.
              super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_4788.
              super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_4788.
              super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              if ((local_4810->mContext).mNwkAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (local_4810->mContext).mNwkAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001b5791:
                jVar9 = jStack_4760;
                if (local_4768 != (undefined1  [8])jStack_4760.object) {
                  psVar39 = &((Error *)((long)local_4768 + 0x178))->mMessage;
                  do {
                    if (*(int *)((long)&psVar39[-1].field_2 + 8) == 0) {
                      local_4858 = (undefined1  [8])((ulong)local_4858 & 0xffffffffffffff00);
                      jStack_4850.object = (object_t *)0x0;
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                          *)local_4858);
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                          *)local_4858);
                      BorderAgentToJson((BorderAgent *)(psVar39 + -0xc),
                                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                         *)local_4858);
                      pbVar23 = (local_4810->mContext).mNwkAliases.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pbVar25 = (local_4810->mContext).mNwkAliases.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      pbVar27 = (local_4810->mContext).mDomAliases.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pbVar4 = (local_4810->mContext).mDomAliases.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      if (pbVar27 == pbVar4 && pbVar23 == pbVar25) {
LAB_001b5831:
                        nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                     *)local_4730,
                                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                     *)local_4858);
                      }
                      else {
                        if ((pbVar27 != pbVar4) &&
                           ((psVar39[-1].field_2._M_local_buf[1] & 0x10U) != 0)) {
                          _Var11 = std::operator==(psVar39 + -3,pbVar27);
                          if (_Var11) goto LAB_001b5831;
                          pbVar23 = (local_4810->mContext).mNwkAliases.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pbVar25 = (local_4810->mContext).mNwkAliases.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                        }
                        if (((pbVar23 != pbVar25) &&
                            ((psVar39[-1].field_2._M_local_buf[0] & 0x20U) != 0)) &&
                           (_Var24 = std::
                                     __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                               (local_47b8._0_8_,local_47b8._8_8_,
                                                &psVar39[-8].field_2),
                           _Var24._M_current != (unsigned_long *)local_47b8._8_8_))
                        goto LAB_001b5831;
                      }
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                     *)local_4858);
                    }
                    else {
                      Console::Write(psVar39,kRed);
                    }
                    psVar40 = psVar39 + 1;
                    psVar39 = psVar39 + 0xd;
                  } while (psVar40 != (string *)jVar9.object);
                }
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::dump(&local_40a8,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4730,4,' ',false,strict);
                Value::Value((Value *)local_4858,&local_40a8);
                Value::operator=(__return_storage_ptr__,(Value *)local_4858);
                Value::~Value((Value *)local_4858);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_40a8._M_dataplus._M_p != &local_40a8.field_2) {
LAB_001b5937:
                  operator_delete(local_40a8._M_dataplus._M_p);
                }
              }
              else {
                SVar10 = persistent_storage::Registry::GetNetworkXpansByAliases
                                   ((local_4810->mRegistry).
                                    super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(StringArray *)local_4810,
                                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &local_47b8,(StringArray *)&local_4788);
                if (SVar10 == kSuccess) {
                  local_47e0 = (pointer)local_4788.
                                        super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                                        ._M_impl.super__Vector_impl_data._M_finish;
                  if (local_4788.
                      super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_4788.
                      super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    pIVar29 = (Interpreter *)(local_46b8 + 0x10);
                    pBVar18 = (pointer)local_4788.
                                       super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      local_46a8._32_8_ = local_46a8 + 0x30;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)(local_46a8 + 0x20),pBVar18->_vptr_BorderRouter,
                                 (((string *)&pBVar18->mId)->_M_dataplus)._M_p +
                                 (long)pBVar18->_vptr_BorderRouter);
                      local_46a8._0_8_ = local_46a8 + 0x10;
                      this_02 = pIVar29;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)pIVar29,"failed to resolve","");
                      PrintNetworkMessage(this_02,(string *)(local_46a8 + 0x20),(string *)pIVar29,
                                          kYellow);
                      if ((undefined1 *)local_46a8._0_8_ != local_46a8 + 0x10) {
                        operator_delete((void *)local_46a8._0_8_);
                      }
                      if ((undefined1 *)local_46a8._32_8_ != local_46a8 + 0x30) {
                        operator_delete((void *)local_46a8._32_8_);
                      }
                      pBVar18 = (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                            *)&(pBVar18->mAgent).mAddr)->_M_local_buf + 8);
                    } while (pBVar18 != local_47e0);
                  }
                  if (local_47b8._0_8_ != local_47b8._8_8_) goto LAB_001b5791;
                  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                  args_25.field_1.values_ = aVar33.values_;
                  args_25.desc_ = (unsigned_long_long)local_4628;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_4888,
                             (v10 *)
                             "No known extended PAN ID discovered for network aliases. Please make complete rescan."
                             ,(string_view)ZEXT816(0x55),args_25);
                  local_45f0 = 5;
                  local_45e8 = local_45d8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_45e8,local_4888,
                             (char *)((long)local_4888 + (long)paStack_4880));
                  local_4858._0_4_ = local_45f0;
                  jStack_4850.object = (object_t *)(local_4848 + 8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&jStack_4850,local_45e8,local_45e8 + local_45e0);
                  auStack_4840._16_8_ = &local_4820;
                  local_4828 = (code *)0x0;
                  local_4820._M_local_buf[0] = '\0';
                  Value::operator=(__return_storage_ptr__,(Value *)local_4858);
                  Value::~Value((Value *)local_4858);
                  if (local_45e8 != local_45d8) {
                    operator_delete(local_45e8);
                  }
                  if (local_4888 != (undefined1  [8])local_4878) {
                    operator_delete((void *)local_4888);
                  }
                }
                else {
                  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                  args_20.field_1.values_ = aVar33.values_;
                  args_20.desc_ = (unsigned_long_long)local_4628;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_4888,
                             (v10 *)"Failed to convert network aliases to XPAN IDs",
                             (string_view)ZEXT816(0x2d),args_20);
                  local_45c8 = 0x12;
                  local_45c0 = local_45b0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_45c0,local_4888,
                             (char *)((long)local_4888 + (long)paStack_4880));
                  local_4858._0_4_ = local_45c8;
                  jStack_4850.object = (object_t *)(local_4848 + 8);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&jStack_4850,local_45c0,local_45c0 + local_45b8);
                  auStack_4840._16_8_ = &local_4820;
                  local_4828 = (code *)0x0;
                  local_4820._M_local_buf[0] = '\0';
                  Value::operator=(__return_storage_ptr__,(Value *)local_4858);
                  Value::~Value((Value *)local_4858);
                  if (local_45c0 != local_45b0) {
                    operator_delete(local_45c0);
                  }
                  local_40a8._M_dataplus._M_p = (pointer)local_4888;
                  if (local_4888 != (undefined1  [8])local_4878) goto LAB_001b5937;
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_4788);
              uVar32 = local_47b8._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_47b8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_001b4d56;
            }
            else {
              event_base_loopbreak(event_base);
              std::thread::join();
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_11.field_1.args_ = aVar33.args_;
              args_11.desc_ = (unsigned_long_long)&local_47b8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4888,(v10 *)"Sending mDNS query failed",
                         (string_view)ZEXT816(0x19),args_11);
              local_4578 = 0xb;
              puVar35 = local_4560;
              local_4570 = puVar35;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4570,local_4888,
                         (char *)((long)local_4888 + (long)paStack_4880));
              local_4858._0_4_ = local_4578;
              jStack_4850.object = (object_t *)(local_4848 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&jStack_4850,local_4570,local_4570 + local_4568);
              auStack_4840._16_8_ = &local_4820;
              local_4828 = (code *)0x0;
              local_4820._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4858);
              Value::~Value((Value *)local_4858);
              puVar31 = local_4570;
LAB_001b4d31:
              if (puVar31 != puVar35) {
                operator_delete(puVar31);
              }
              uVar32 = local_4888;
              if (local_4888 != (undefined1  [8])local_4878) {
LAB_001b4d56:
                operator_delete((void *)uVar32);
              }
            }
          }
          else {
            if (_Var16._M_current + 1 == pbVar27) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_08.field_1.values_ = in_R9.values_;
              args_08.desc_ = (unsigned_long_long)&local_47b8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4888,(v10 *)"Missing --timeout value",
                         (string_view)ZEXT816(0x17),args_08);
              local_44d8 = 2;
              puVar36 = local_44c0;
              local_44d0 = puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_44d0,local_4888,
                         (char *)((long)local_4888 + (long)paStack_4880));
              local_4858._0_4_ = local_44d8;
              jStack_4850.object = (object_t *)(local_4848 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&jStack_4850,local_44d0,local_44d0 + local_44c8);
              auStack_4840._16_8_ = &local_4820;
              local_4828 = (code *)0x0;
              local_4820._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4858);
              Value::~Value((Value *)local_4858);
              uVar32 = local_44d0;
              goto LAB_001b459d;
            }
            utils::ParseInteger<unsigned_int>(&local_40d0,&local_476c,_Var16._M_current + 1);
            local_4858._0_4_ = local_40d0.mCode;
            jStack_4850.object = (object_t *)(local_4848 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&jStack_4850,local_40d0.mMessage._M_dataplus._M_p,
                       local_40d0.mMessage._M_dataplus._M_p + local_40d0.mMessage._M_string_length);
            auStack_4840._16_8_ = &local_4820;
            local_4828 = (code *)0x0;
            local_4820._M_local_buf[0] = '\0';
            pVVar17 = Value::operator=(__return_storage_ptr__,(Value *)local_4858);
            EVar2 = (pVVar17->mError).mCode;
            Value::~Value((Value *)local_4858);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40d0.mMessage._M_dataplus._M_p != &local_40d0.mMessage.field_2) {
              operator_delete(local_40d0.mMessage._M_dataplus._M_p);
            }
            if (EVar2 == kNone) {
              pbVar27 = (pIVar29->mContext).mCommandKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              goto LAB_001b40f6;
            }
LAB_001b45c3:
            ev_00 = (event *)0x0;
            uVar13 = 0xffffffff;
            ev = (event *)0x0;
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_4730);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_4730 + 8),local_4730[0]);
          std::
          vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
          ::~vector((vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
                     *)local_4768);
          if (ev_00 != (event *)0x0) {
            event_free(ev_00);
          }
          if (ev != (event *)0x0) {
            event_free(ev);
          }
          if (local_4790 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
LAB_001b6410:
            std::terminate();
          }
          anon_unknown_34::FDGuard::~FDGuard((FDGuard *)(ulong)uVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4808._M_dataplus._M_p != &local_4808.field_2) {
            operator_delete(local_4808._M_dataplus._M_p);
          }
          _Var28._M_p = local_47d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_47d8._M_dataplus._M_p == &local_47d8.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_001b2506;
        }
        local_4858._0_4_ = 0xd;
        jStack_4850.object = (object_t *)0x263f4f;
        local_4848 = (undefined1  [8])0x1f;
        auStack_4840._0_8_ = 0x100000000;
        auStack_4840._16_8_ =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        pcVar22 = "\'{}\' is not a valid sub-command";
        auStack_4840._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4858;
        do {
          pcVar14 = pcVar22 + 1;
          if (*pcVar22 == '}') {
            if ((pcVar14 == "") || (*pcVar14 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar14 = pcVar22 + 2;
          }
          else if (*pcVar22 == '{') {
            pcVar14 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar22,"",(format_string_checker<char> *)local_4858);
          }
          pcVar22 = pcVar14;
        } while (pcVar14 != "");
        pbVar23 = (aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_4858 = (undefined1  [8])pbVar23[1]._M_dataplus._M_p;
        jStack_4850 = (json_value)pbVar23[1]._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1f;
        args_07.field_1.args_ = in_R9.args_;
        args_07.desc_ = (unsigned_long_long)local_4858;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_4888,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_07);
        local_4618 = 3;
        pcVar22 = local_4600;
        local_4610 = pcVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4610,local_4888,(char *)((long)local_4888 + (long)paStack_4880))
        ;
        local_4038._0_4_ = local_4618;
        _Stack_4030._M_p = (pointer)(local_4028 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&_Stack_4030,local_4610,local_4610 + local_4608);
        local_4008 = (pointer)0x0;
        local_4000[0]._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
        local_4010._M_p = (pointer)local_4000;
        std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
        std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4010._M_p != local_4000) {
          operator_delete(local_4010._M_p);
        }
        pcVar14 = local_4610;
        if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
          operator_delete(_Stack_4030._M_p);
          pcVar14 = local_4610;
        }
      }
      if (pcVar14 != pcVar22) {
        operator_delete(pcVar14);
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4878;
      _Var28._M_p = (pointer)local_4888;
      goto LAB_001b24fd;
    }
    paStack_4880 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_4878 + 8);
    local_4888 = (undefined1  [8])((ulong)local_4888 & 0xffffffff00000000);
    local_4878._0_8_ = (char *)0x0;
    local_4878[8] = '\0';
    local_47d8._M_dataplus._M_p = (pointer)&local_47d8.field_2;
    local_47d8._M_string_length = 0;
    local_47d8.field_2._M_allocated_capacity =
         local_47d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_4740._0_8_ = local_4740._0_8_ & 0xffffffffffffff00;
    local_4740._8_8_ = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4740);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4740);
    local_4788.
    super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4788.
    super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4788.
    super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pbVar23 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar15 = (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23;
    if (uVar15 < 0x41) {
      local_4858 = (undefined1  [8])((ulong)(uint)local_4858._4_4_ << 0x20);
      jStack_4850.object = (object_t *)0x2640ac;
      local_4848 = (undefined1  [8])0x1d;
      auStack_4840._0_8_ = 0;
      auStack_4840._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      pcVar22 = "input JSON file path required";
      auStack_4840._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_4858;
      do {
        pcVar14 = pcVar22 + 1;
        if (*pcVar22 == '}') {
          if ((pcVar14 == "") || (*pcVar14 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar14 = pcVar22 + 2;
        }
        else if (*pcVar22 == '{') {
          pcVar14 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar22,"",(format_string_checker<char> *)local_4858);
        }
        pcVar22 = pcVar14;
      } while (pcVar14 != "");
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_4858;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_4808,(v10 *)"input JSON file path required",(string_view)ZEXT816(0x1d),
                 args_02);
      local_41e0 = 2;
      puVar36 = local_41c8;
      local_41d8 = puVar36;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_41d8,local_4808._M_dataplus._M_p,
                 local_4808._M_dataplus._M_p + local_4808._M_string_length);
      local_4038._0_4_ = local_41e0;
      _Stack_4030._M_p = (pointer)(local_4028 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_4030,local_41d8,local_41d8 + local_41d0);
      local_4008 = (pointer)0x0;
      local_4000[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
      local_4010._M_p = (pointer)local_4000;
      std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
      std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4010._M_p != local_4000) {
        operator_delete(local_4010._M_p);
      }
      puVar30 = local_41d8;
      if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
        operator_delete(_Stack_4030._M_p);
        puVar30 = local_41d8;
      }
LAB_001b32df:
      if (puVar30 != puVar36) {
        operator_delete(puVar30);
      }
LAB_001b32f5:
      _Var28._M_p = local_4808._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4808._M_dataplus._M_p != &local_4808.field_2) {
LAB_001b32fa:
        operator_delete(_Var28._M_p);
      }
    }
    else {
      if (uVar15 != 0x60) {
        local_4858 = (undefined1  [8])((ulong)(uint)local_4858._4_4_ << 0x20);
        jStack_4850.object = (object_t *)0x264000;
        local_4848 = (undefined1  [8])0x12;
        auStack_4840._0_8_ = 0;
        auStack_4840._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pcVar22 = "too many arguments";
        auStack_4840._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4858;
        do {
          pcVar14 = pcVar22 + 1;
          if (*pcVar22 == '}') {
            if ((pcVar14 == "") || (*pcVar14 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar14 = pcVar22 + 2;
          }
          else if (*pcVar22 == '{') {
            pcVar14 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar22,"",(format_string_checker<char> *)local_4858);
          }
          pcVar22 = pcVar14;
        } while (pcVar14 != "");
        args_03.field_1.args_ = in_R9.args_;
        args_03.desc_ = (unsigned_long_long)local_4858;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_4808,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_03);
        local_4208 = 2;
        puVar36 = local_41f0;
        local_4200 = puVar36;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4200,local_4808._M_dataplus._M_p,
                   local_4808._M_dataplus._M_p + local_4808._M_string_length);
        local_4038._0_4_ = local_4208;
        _Stack_4030._M_p = (pointer)(local_4028 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&_Stack_4030,local_4200,local_4200 + local_41f8);
        local_4008 = (pointer)0x0;
        local_4000[0]._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
        local_4010._M_p = (pointer)local_4000;
        std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
        std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4010._M_p != local_4000) {
          operator_delete(local_4010._M_p);
        }
        puVar30 = local_4200;
        if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
          operator_delete(_Stack_4030._M_p);
          puVar30 = local_4200;
        }
        goto LAB_001b32df;
      }
      JsonFromFile((Error *)local_4038,&local_47d8,pbVar23 + 2);
      local_4888._0_4_ = local_4038._0_4_;
      std::__cxx11::string::operator=((string *)&paStack_4880,(string *)&_Stack_4030);
      uVar5 = local_4888._0_4_;
      if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
        operator_delete(_Stack_4030._M_p);
      }
      if (uVar5 != 0) {
        local_4230 = local_4888._0_4_;
        local_4228 = &local_4218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4228,paStack_4880,
                   (char *)(local_4878._0_8_ + (long)paStack_4880));
        local_4038._0_4_ = local_4230;
        _Stack_4030._M_p = (pointer)(local_4028 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&_Stack_4030,local_4228,(char *)(local_4220 + (long)local_4228));
        local_4010._M_p = (pointer)local_4000;
        local_4008 = (pointer)0x0;
        local_4000[0]._M_local_buf[0] = '\0';
        Value::operator=(__return_storage_ptr__,(Value *)local_4038);
        Value::~Value((Value *)local_4038);
        _Var28._M_p = (pointer)local_4228;
        if (local_4228 == &local_4218) goto LAB_001b32ff;
        goto LAB_001b32fa;
      }
      nlohmann::detail::input_adapter::
      input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                ((input_adapter *)local_4038,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_47d8._M_dataplus._M_p,
                 (char *)(local_47d8._M_string_length + (long)local_47d8._M_dataplus._M_p));
      local_4108 = (code *)0x0;
      uStack_4100 = 0;
      local_4118._M_unused._M_object = (void *)0x0;
      local_4118._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse(&local_4088,(input_adapter *)local_4038,(parser_callback_t *)&local_4118,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_4740,&local_4088);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_4088);
      if (local_4108 != (code *)0x0) {
        (*local_4108)(&local_4118,&local_4118,__destroy_functor);
      }
      if ((pointer)_Stack_4030._M_p != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_4030._M_p);
      }
      if (local_4740[0] == array) {
        local_4808._M_string_length = 0;
        local_4808.field_2._M_allocated_capacity = 0;
        local_4808.field_2._8_8_ = 0x8000000000000000;
        local_4808._M_dataplus._M_p = (pointer)local_4740;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     *)&local_4808);
        local_47b8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        aStack_47a8._M_allocated_capacity = 0;
        aStack_47a8._8_8_ = 0x8000000000000000;
        local_47b8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_4740;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *)&local_47b8);
        while (bVar42 = nlohmann::detail::
                        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                      *)&local_4808,
                                     (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                      *)&local_47b8), !bVar42) {
          aJson = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_4808);
          BorderAgent::BorderAgent((BorderAgent *)local_4038);
          BorderAgentFromJson((BorderAgent *)local_4038,aJson);
          std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ::push_back(&local_4788,(BorderAgent *)local_4038);
          BorderAgent::~BorderAgent((BorderAgent *)local_4038);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_4808);
        }
      }
      else {
        BorderAgent::BorderAgent((BorderAgent *)local_4038);
        BorderAgentFromJson((BorderAgent *)local_4038,(json *)local_4740);
        std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
        push_back(&local_4788,(value_type *)local_4038);
        BorderAgent::~BorderAgent((BorderAgent *)local_4038);
      }
      if (local_4788.
          super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_4788.
          super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar18 = (pointer)local_4788.
                           super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        pBVar41 = (pointer)local_4788.
                           super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((~*(uint *)((long)&(pBVar18->mAgent).mServiceName.field_2 + 8) & 0x3f) != 0) {
            local_4858 = (undefined1  [8])0x200000002;
            pcVar22 = 
            "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})";
            jStack_4850.object = (object_t *)0x264184;
            local_4848 = (undefined1  [8])0x4f;
            auStack_4840._0_8_ = 0x200000000;
            auStack_4840._16_8_ =
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
            local_4828 = ::fmt::v10::detail::
                         parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
            ;
            auStack_4840._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_4858;
            local_47b8._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_4858;
            do {
              cVar1 = *pcVar22;
              pcVar14 = pcVar22;
              while (cVar1 != '{') {
                pcVar14 = pcVar14 + 1;
                if (pcVar14 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int>_>
                  ::writer::operator()((writer *)&local_47b8._M_allocated_capacity,pcVar22,"");
                  goto LAB_001b4acc;
                }
                cVar1 = *pcVar14;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int>_>
              ::writer::operator()((writer *)&local_47b8._M_allocated_capacity,pcVar22,pcVar14);
              pcVar22 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int,unsigned_int>&>
                                  (pcVar14,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_4858);
            } while (pcVar22 != "");
LAB_001b4acc:
            local_4858 = (undefined1  [8])
                         (ulong)*(uint *)((long)&(pBVar18->mAgent).mServiceName.field_2 + 8);
            local_4848 = (undefined1  [8])0x3f;
            fmt_03.size_ = 0x22;
            fmt_03.data_ = (char *)0x4f;
            args_15.field_1.args_ = in_R9.args_;
            args_15.desc_ = (unsigned_long_long)local_4858;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_4808,
                       (v10 *)
                       "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})"
                       ,fmt_03,args_15);
            local_42d0 = 0x10;
            puVar36 = local_42b8;
            local_42c8 = puVar36;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_42c8,local_4808._M_dataplus._M_p,
                       local_4808._M_dataplus._M_p + local_4808._M_string_length);
            local_4038._0_4_ = local_42d0;
            _Stack_4030._M_p = (pointer)(local_4028 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4030,local_42c8,local_42c8 + local_42c0);
            local_4008 = (pointer)0x0;
            local_4000[0]._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
            local_4010._M_p = (pointer)local_4000;
            std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
            std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4010._M_p != local_4000) {
              operator_delete(local_4010._M_p);
            }
            puVar30 = local_42c8;
            if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
              operator_delete(_Stack_4030._M_p);
              puVar30 = local_42c8;
            }
            goto LAB_001b32df;
          }
          if ((pBVar18->mAgent).mNetworkName.field_2._M_allocated_capacity == 0) {
            local_4858 = (undefined1  [8])0x20000000d;
            pcVar22 = "XPAN required but not provided for border agent host:port {}:{}";
            jStack_4850.object = (object_t *)0x2641d4;
            local_4848 = (undefined1  [8])0x3f;
            auStack_4840._0_8_ = 0x200000000;
            auStack_4840._16_8_ =
                 ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_4828 = ::fmt::v10::detail::
                         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
            ;
            auStack_4840._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_4858;
            local_47b8._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_4858;
            do {
              cVar1 = *pcVar22;
              pcVar14 = pcVar22;
              while (cVar1 != '{') {
                pcVar14 = pcVar14 + 1;
                if (pcVar14 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                  ::writer::operator()((writer *)&local_47b8._M_allocated_capacity,pcVar22,"");
                  goto LAB_001b4d77;
                }
                cVar1 = *pcVar14;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
              ::writer::operator()((writer *)&local_47b8._M_allocated_capacity,pcVar22,pcVar14);
              pcVar22 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                                  (pcVar14,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_4858);
            } while (pcVar22 != "");
LAB_001b4d77:
            local_4858 = (undefined1  [8])(((string *)&pBVar18->mId)->_M_dataplus)._M_p;
            jStack_4850 = (json_value)(pBVar18->mAgent)._vptr_BorderAgent;
            local_4848 = (undefined1  [8])
                         (ulong)*(ushort *)
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&(pBVar18->mAgent).mAddr + 1);
            fmt_04.size_ = 0x2d;
            fmt_04.data_ = (char *)0x3f;
            args_17.field_1.args_ = in_R9.args_;
            args_17.desc_ = (unsigned_long_long)local_4858;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_4808,
                       (v10 *)"XPAN required but not provided for border agent host:port {}:{}",
                       fmt_04,args_17);
            local_42f8 = 0x10;
            puVar36 = local_42e0;
            local_42f0 = puVar36;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_42f0,local_4808._M_dataplus._M_p,
                       local_4808._M_dataplus._M_p + local_4808._M_string_length);
            local_4038._0_4_ = local_42f8;
            _Stack_4030._M_p = (pointer)(local_4028 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4030,local_42f0,local_42f0 + local_42e8);
            local_4008 = (pointer)0x0;
            local_4000[0]._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
            local_4010._M_p = (pointer)local_4000;
            std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
            std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4010._M_p != local_4000) {
              operator_delete(local_4010._M_p);
            }
            puVar30 = local_42f0;
            if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
              operator_delete(_Stack_4030._M_p);
              puVar30 = local_42f0;
            }
            goto LAB_001b32df;
          }
          local_47b8._0_8_ = local_47b8._0_8_ & 0xffffffffffffff00;
          local_4038 = (undefined1  [8])&local_47b8;
          lVar37 = (long)pBVar18 -
                   (long)local_4788.
                         super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          lVar34 = (lVar37 >> 3) * 0x51b3bea3677d46cf >> 2;
          __it._M_current =
               local_4788.
               super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_4798 = pBVar18;
          _Stack_4030._M_p = (pointer)pBVar18;
          if (0 < lVar34) {
            lVar34 = lVar34 + 1;
            lVar37 = (long)pBVar41 -
                     (long)local_4788.
                           super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            do {
              bVar42 = __gnu_cxx::__ops::
                       _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                       ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                     *)local_4038,__it);
              _Var26._M_current = __it._M_current;
              pIVar29 = local_4810;
              if (bVar42) goto LAB_001b40b0;
              bVar42 = __gnu_cxx::__ops::
                       _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                       ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                     *)local_4038,__it._M_current + 1);
              _Var26._M_current = __it._M_current + 1;
              pIVar29 = local_4810;
              if (bVar42) goto LAB_001b40b0;
              bVar42 = __gnu_cxx::__ops::
                       _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                       ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                     *)local_4038,__it._M_current + 2);
              _Var26._M_current = __it._M_current + 2;
              pIVar29 = local_4810;
              if (bVar42) goto LAB_001b40b0;
              bVar42 = __gnu_cxx::__ops::
                       _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                       ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                     *)local_4038,__it._M_current + 3);
              _Var26._M_current = __it._M_current + 3;
              pIVar29 = local_4810;
              if (bVar42) goto LAB_001b40b0;
              __it._M_current = __it._M_current + 4;
              lVar34 = lVar34 + -1;
              lVar37 = lVar37 + -0x5e0;
            } while (1 < lVar34);
          }
          pBVar18 = local_4798;
          lVar34 = (lVar37 >> 3) * 0x51b3bea3677d46cf;
          pIVar29 = local_4810;
          if (lVar34 == 1) {
LAB_001b409c:
            bVar42 = __gnu_cxx::__ops::
                     _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                     ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                   *)local_4038,__it);
            _Var26._M_current = __it._M_current;
            if (!bVar42) {
              _Var26._M_current = (BorderAgent *)pBVar18;
            }
LAB_001b40b0:
            if ((pointer)_Var26._M_current == local_4798) goto LAB_001b40c1;
            if ((local_47b8._0_8_ & 1) != 0) {
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_4858 = (undefined1  [8])(((string *)&local_4798->mId)->_M_dataplus)._M_p;
              jStack_4850 = (json_value)(local_4798->mAgent)._vptr_BorderAgent;
              local_4848 = (undefined1  [8])
                           (ulong)*(ushort *)
                                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)&(local_4798->mAgent).mAddr + 1);
              fmt_05.size_ = 0x2d;
              fmt_05.data_ = (char *)0x4a;
              args_18.field_1.values_ = in_R9.values_;
              args_18.desc_ = (unsigned_long_long)local_4858;
              ::fmt::v10::vformat_abi_cxx11_
                        (&local_4808,
                         (v10 *)
                         "Address {} and port {} combination is not unique for inbound border agents"
                         ,fmt_05,args_18);
              local_4320 = 0x10;
              puVar36 = local_4308;
              local_4318 = puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4318,local_4808._M_dataplus._M_p,
                         local_4808._M_dataplus._M_p + local_4808._M_string_length);
              local_4038._0_4_ = local_4320;
              _Stack_4030._M_p = (pointer)(local_4028 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4030,local_4318,local_4318 + local_4310);
              local_4010._M_p = (pointer)local_4000;
              local_4008 = (pointer)0x0;
              local_4000[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4038);
              Value::~Value((Value *)local_4038);
              puVar30 = local_4318;
              goto LAB_001b32df;
            }
            if ((local_47b8._0_8_ & 2) == 0) {
              if ((local_47b8._0_8_ & 4) == 0) goto LAB_001b32ff;
              ::fmt::v10::detail::
              check_format_string<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_4858 = (undefined1  [8])
                           (local_4798->mAgent).mNetworkName.field_2._M_allocated_capacity;
              local_4848 = *(undefined1 (*) [8])
                            ((long)&(local_4798->mAgent).mVendorOui.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data + 8);
              auStack_4840._0_8_ =
                   *(pointer *)
                    ((long)&(local_4798->mAgent).mVendorOui.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 0x10);
              auStack_4840._8_8_ =
                   (((BorderAgent *)&(_Var26._M_current)->mAddr)->mVendorOui).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              auStack_4840._16_8_ =
                   (((BorderAgent *)&(_Var26._M_current)->mAddr)->mVendorOui).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              fmt_07.size_ = 0xdd4;
              fmt_07.data_ = (char *)0x59;
              args_21.field_1.values_ = in_R9.values_;
              args_21.desc_ = (unsigned_long_long)local_4858;
              ::fmt::v10::vformat_abi_cxx11_
                        (&local_4808,
                         (v10 *)
                         "Two inbound border agents have same XPAN \'{}\', but different domain names (\'{}\' and \'{}\')"
                         ,fmt_07,args_21);
              local_4370 = 0x10;
              puVar36 = local_4358;
              local_4368 = puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4368,local_4808._M_dataplus._M_p,
                         local_4808._M_dataplus._M_p + local_4808._M_string_length);
              local_4038._0_4_ = local_4370;
              _Stack_4030._M_p = (pointer)(local_4028 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4030,local_4368,local_4368 + local_4360);
              local_4010._M_p = (pointer)local_4000;
              local_4008 = (pointer)0x0;
              local_4000[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4038);
              Value::~Value((Value *)local_4038);
              puVar30 = local_4368;
            }
            else {
              ::fmt::v10::detail::
              check_format_string<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_4858 = (undefined1  [8])
                           (local_4798->mAgent).mNetworkName.field_2._M_allocated_capacity;
              local_4848 = *(undefined1 (*) [8])
                            ((long)&(local_4798->mAgent).mThreadVersion.field_2 + 8);
              auStack_4840._0_8_ = *(undefined8 *)&(local_4798->mAgent).mState;
              auStack_4840._8_8_ =
                   *(undefined8 *)
                    ((long)&(((BorderAgent *)&(_Var26._M_current)->mAddr)->mThreadVersion).field_2 +
                    8);
              auStack_4840._16_8_ =
                   *(undefined8 *)&(((BorderAgent *)&(_Var26._M_current)->mAddr)->mState).field_0x0;
              fmt_10.size_ = 0xdd4;
              fmt_10.data_ = (char *)0x5a;
              args_24.field_1.values_ = in_R9.values_;
              args_24.desc_ = (unsigned_long_long)local_4858;
              ::fmt::v10::vformat_abi_cxx11_
                        (&local_4808,
                         (v10 *)
                         "Two inbound border agents have same XPAN \'{}\', but different network names (\'{}\' and \'{}\')"
                         ,fmt_10,args_24);
              local_4348 = 0x10;
              puVar36 = local_4330;
              local_4340 = puVar36;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4340,local_4808._M_dataplus._M_p,
                         local_4808._M_dataplus._M_p + local_4808._M_string_length);
              local_4038._0_4_ = local_4348;
              _Stack_4030._M_p = (pointer)(local_4028 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4030,local_4340,local_4340 + local_4338);
              local_4010._M_p = (pointer)local_4000;
              local_4008 = (pointer)0x0;
              local_4000[0]._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_4038);
              Value::~Value((Value *)local_4038);
              puVar30 = local_4340;
            }
            goto LAB_001b32df;
          }
          if (lVar34 == 2) {
LAB_001b406f:
            pIVar29 = local_4810;
            bVar42 = __gnu_cxx::__ops::
                     _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                     ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                   *)local_4038,__it);
            _Var26._M_current = __it._M_current;
            if (!bVar42) {
              __it._M_current = __it._M_current + 1;
              goto LAB_001b409c;
            }
            goto LAB_001b40b0;
          }
          if (lVar34 == 3) {
            bVar42 = __gnu_cxx::__ops::
                     _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                     ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                   *)local_4038,__it);
            _Var26._M_current = __it._M_current;
            pIVar29 = local_4810;
            if (!bVar42) {
              __it._M_current = __it._M_current + 1;
              goto LAB_001b406f;
            }
            goto LAB_001b40b0;
          }
LAB_001b40c1:
          pBVar7 = local_4798;
          pBVar18 = (pointer)&(local_4798->mAgent).mUpdateTimestamp;
          pBVar41 = (pointer)&(pBVar41->mAgent).mUpdateTimestamp;
        } while (pBVar18 !=
                 (pointer)local_4788.
                          super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        if ((pointer)local_4788.
                     super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                     ._M_impl.super__Vector_impl_data._M_start != pBVar18) {
          pBVar18 = (pointer)local_4788.
                             super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                             ._M_impl.super__Vector_impl_data._M_start;
LAB_001b4c00:
          SVar10 = persistent_storage::Registry::Add
                             ((pIVar29->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(BorderAgent *)pBVar18);
          if (SVar10 == kSuccess) goto code_r0x001b4c18;
          local_4858 = (undefined1  [8])0x20000000d;
          pcVar22 = "Insertion failure with border agent address {} and port {}";
          jStack_4850.object = (object_t *)0x264314;
          local_4848 = (undefined1  [8])0x3a;
          auStack_4840._0_8_ = 0x200000000;
          auStack_4840._16_8_ =
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_4828 = ::fmt::v10::detail::
                       parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
          ;
          auStack_4840._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_4858;
          local_47b8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_4858;
          do {
            cVar1 = *pcVar22;
            pcVar14 = pcVar22;
            while (cVar1 != '{') {
              pcVar14 = pcVar14 + 1;
              if (pcVar14 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                ::writer::operator()((writer *)&local_47b8._M_allocated_capacity,pcVar22,"");
                goto LAB_001b5473;
              }
              cVar1 = *pcVar14;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
            ::writer::operator()((writer *)&local_47b8._M_allocated_capacity,pcVar22,pcVar14);
            pcVar22 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                                (pcVar14,"",
                                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_4858);
          } while (pcVar22 != "");
LAB_001b5473:
          local_4858 = (undefined1  [8])(((string *)&pBVar18->mId)->_M_dataplus)._M_p;
          jStack_4850 = (json_value)(pBVar18->mAgent)._vptr_BorderAgent;
          local_4848 = (undefined1  [8])
                       (ulong)*(ushort *)
                               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(pBVar18->mAgent).mAddr + 1);
          fmt_09.size_ = 0x2d;
          fmt_09.data_ = (char *)0x3a;
          args_23.field_1.args_ = in_R9.args_;
          args_23.desc_ = (unsigned_long_long)local_4858;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_4808,(v10 *)"Insertion failure with border agent address {} and port {}"
                     ,fmt_09,args_23);
          local_46d0 = 0x12;
          local_46c8 = local_46b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_46c8,local_4808._M_dataplus._M_p,
                     local_4808._M_dataplus._M_p + local_4808._M_string_length);
          local_4038._0_4_ = local_46d0;
          _Stack_4030._M_p = (pointer)(local_4028 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&_Stack_4030,local_46c8,local_46c8 + local_46c0);
          local_4008 = (pointer)0x0;
          local_4000[0]._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_4038._0_4_;
          local_4010._M_p = (pointer)local_4000;
          std::__cxx11::string::operator=((string *)local_47e0,(string *)&_Stack_4030);
          std::__cxx11::string::operator=((string *)psVar39,(string *)&local_4010);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4010._M_p != local_4000) {
            operator_delete(local_4010._M_p);
          }
          if ((pointer)_Stack_4030._M_p != (pointer)(local_4028 + 8)) {
            operator_delete(_Stack_4030._M_p);
          }
          if (local_46c8 != local_46b8) {
            operator_delete(local_46c8);
          }
          goto LAB_001b32f5;
        }
      }
    }
LAB_001b32ff:
    std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
    ~vector(&local_4788);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4740);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_4740 + 8),local_4740[0]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_47d8._M_dataplus._M_p != &local_47d8.field_2) {
      operator_delete(local_47d8._M_dataplus._M_p);
    }
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_4878 + 8);
    _Var28._M_p = (pointer)paStack_4880;
  }
LAB_001b24fd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var28._M_p == paVar20) {
    return __return_storage_ptr__;
  }
LAB_001b2506:
  operator_delete(_Var28._M_p);
  return __return_storage_ptr__;
code_r0x001b4c18:
  bVar42 = pBVar18 == pBVar7;
  pBVar18 = (pointer)&(pBVar18->mAgent).mUpdateTimestamp;
  if (bVar42) goto LAB_001b32ff;
  goto LAB_001b4c00;
}

Assistant:

Interpreter::Value Interpreter::ProcessBr(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        nlohmann::json            json;
        std::vector<BorderRouter> routers;
        std::vector<Network>      networks;
        RegistryStatus            status;

        VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        if (mContext.mDomAliases.size() > 0)
        {
            for (const auto &dom : mContext.mDomAliases)
            {
                std::vector<Network> domNetworks;
                status = mRegistry->GetNetworksInDomain(dom, domNetworks);
                if (status != RegistryStatus::kSuccess)
                {
                    PrintNetworkMessage(dom, "domain name unknown", COLOR_ALIAS_FAILED);
                }
                else
                {
                    networks.insert(networks.end(), domNetworks.begin(), domNetworks.end());
                }
            }
        }
        else if (mContext.mNwkAliases.size() > 0)
        {
            StringArray unresolved;
            status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
            // no need to announce unresolved items here as those were
            // displayed in the course of ValidateMultiNetworkSyntax()
            VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
        }
        else
        {
            status = mRegistry->GetAllBorderRouters(routers);
            if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
            }
        }
        if (networks.size() > 0)
        {
            for (const auto &nwk : networks)
            {
                std::vector<BorderRouter> nwkRouters;
                status = mRegistry->GetBorderRoutersInNetwork(nwk.mXpan, nwkRouters);
                if (status == RegistryStatus::kSuccess)
                {
                    routers.insert(routers.end(), nwkRouters.begin(), nwkRouters.end());
                }
                else
                {
                    PrintNetworkMessage(nwk.mXpan, RUNTIME_LOOKUP_FAILED, COLOR_ALIAS_FAILED);
                }
            }
        }
        if (routers.size() > 0)
        {
            json  = routers;
            value = json.dump(JSON_INDENT_DEFAULT);
        }
        else
        {
            value = Value("[]");
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "add"))
    {
        Error                    error;
        std::string              jsonStr;
        nlohmann::json           json;
        std::vector<BorderAgent> agents;

        if (aExpr.size() < 3)
        {
            ExitNow(value = ERROR_INVALID_ARGS("input JSON file path required"));
        }
        else if (aExpr.size() > 3)
        {
            ExitNow(value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        }

        VerifyOrExit((error = JsonFromFile(jsonStr, aExpr[2])) == ERROR_NONE, value = Value(error));

        try
        {
            json = nlohmann::json::parse(jsonStr);
        } catch (std::exception &e)
        {
            ExitNow(value = ERROR_BAD_FORMAT("failed to parse JSON: {}", e.what()));
        }

        // Can be either single BorderAgent or an array of them.
        if (!json.is_array())
        {
            // Parse single BorderAgent
            BorderAgent ba;
            try
            {
                BorderAgentFromJson(ba, json);
            } catch (std::exception &e)
            {
                ExitNow(value = ERROR_BAD_FORMAT("incorrect border agent JSON format: {}", e.what()));
            }
            agents.push_back(ba);
        }
        else
        {
            for (const auto &jsonObject : json)
            {
                BorderAgent ba;
                try
                {
                    BorderAgentFromJson(ba, jsonObject);
                } catch (std::exception &e)
                {
                    ExitNow(value = ERROR_BAD_FORMAT("incorrect border agent JSON format: {}", e.what()));
                }
                agents.push_back(ba);
            }
        }
        // Sanity check of BorderAgent records
        for (auto iter = agents.begin(); iter != agents.end(); ++iter)
        {
            // Check mandatory fields present
            // By Thread 1.1.1 spec table 8-4
            constexpr const uint32_t kMandatoryFieldsBits =
                (BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kThreadVersionBit |
                 BorderAgent::kStateBit | BorderAgent::kNetworkNameBit | BorderAgent::kExtendedPanIdBit);
            if ((iter->mPresentFlags & kMandatoryFieldsBits) != kMandatoryFieldsBits)
            {
                ExitNow(value = ERROR_REJECTED(
                            "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})",
                            iter->mPresentFlags, kMandatoryFieldsBits));
            }

            // Check local network information sanity
            constexpr const uint32_t kNetworkInfoBits =
                (BorderAgent::kExtendedPanIdBit | BorderAgent::kNetworkNameBit | BorderAgent::kDomainNameBit);
            if (((iter->mPresentFlags & kNetworkInfoBits) != 0) &&
                (((iter->mPresentFlags & BorderAgent::kExtendedPanIdBit) == 0) || (iter->mExtendedPanId == 0)))
            {
                ExitNow(value = ERROR_REJECTED("XPAN required but not provided for border agent host:port {}:{}",
                                               iter->mAddr, iter->mPort));
            }

            // Sanity check across inbound data
            if (iter->mPresentFlags & BorderAgent::kExtendedPanIdBit)
            {
                struct
                {
                    bool addr : 1;
                    bool name : 1;
                    bool domain : 1;
                } flags = {false, false, false};

                // Network: (XPAN, PAN) combination must be same everywhere
                std::vector<BorderAgent>::iterator found =
                    std::find_if(agents.begin(), iter, [=, &flags](BorderAgent a) {
                        flags.addr = (iter->mAddr == a.mAddr && iter->mPort == a.mPort);
                        if (flags.addr)
                        {
                            return true;
                        }

#define CHECK_PRESENT_FLAG(record, flag) ((record).mPresentFlags & BorderAgent::k##flag##Bit)
                        if (CHECK_PRESENT_FLAG(a, ExtendedPanId) == 0)
                        {
                            return false;
                        }
                        flags.name = (CHECK_PRESENT_FLAG(a, NetworkName) != CHECK_PRESENT_FLAG(*iter, NetworkName)) ||
                                     ((CHECK_PRESENT_FLAG(*iter, NetworkName) != 0) &&
                                      iter->mExtendedPanId == a.mExtendedPanId && iter->mNetworkName != a.mNetworkName);
                        flags.domain = (CHECK_PRESENT_FLAG(a, DomainName) && CHECK_PRESENT_FLAG(*iter, DomainName)) &&
                                       (iter->mExtendedPanId == a.mExtendedPanId && iter->mDomainName != a.mDomainName);
                        return flags.name || flags.domain;
#undef CHECK_PRESENT_FLAG
                    });
                if (found != iter)
                {
                    if (flags.addr)
                    {
                        value =
                            ERROR_REJECTED("Address {} and port {} combination is not unique for inbound border agents",
                                           iter->mAddr, iter->mPort);
                    }
                    else if (flags.name)
                    {
                        value = ERROR_REJECTED("Two inbound border agents have same XPAN '{}', but different network "
                                               "names ('{}' and '{}')",
                                               iter->mExtendedPanId, iter->mNetworkName, found->mNetworkName);
                    }
                    else if (flags.domain)
                    {
                        value = ERROR_REJECTED(
                            "Two inbound border agents have same XPAN '{}', but different domain names ('{}' and '{}')",
                            iter->mExtendedPanId, iter->mDomainName, found->mDomainName);
                    }
                    ExitNow();
                }
            }
        }

        for (const auto &agent : agents)
        {
            auto status = mRegistry->Add(agent);
            if (status != RegistryStatus::kSuccess)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR("Insertion failure with border agent address {} and port {}",
                                                     agent.mAddr, agent.mPort));
            }
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "delete"))
    {
        if (aExpr.size() > 3 || (aExpr.size() == 3 && !(mContext.mNwkAliases.empty() && mContext.mDomAliases.empty())))
        {
            ExitNow(value = ERROR_INVALID_ARGS("Too many arguments for `br delete` command`"));
        }
        else if (aExpr.size() == 3)
        {
            // Attempt to remove border agent by BorderRouterId
            BorderRouterId brId;
            try
            {
                brId = BorderRouterId(std::stoi(aExpr[2]));
            } catch (...)
            {
                ExitNow(value = ERROR_INVALID_ARGS("Failed to evaluate border router ID '{}'", aExpr[2]));
            }
            auto status = mRegistry->DeleteBorderRouterById(brId);
            if (status == RegistryStatus::kRestricted)
            {
                value = ERROR_REGISTRY_ERROR("Failed to delete border router ID {}: last router in the current network",
                                             aExpr[2]);
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value = ERROR_REGISTRY_ERROR("Failed to delete border router ID {}", aExpr[2]);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
        else if (mContext.mNwkAliases.size() > 0)
        {
            StringArray unresolved;
            // Remove all border agents in the networks
            auto status = mRegistry->DeleteBorderRoutersInNetworks(mContext.mNwkAliases, unresolved);
            if (status == RegistryStatus::kRestricted)
            {
                value = ERROR_REGISTRY_ERROR("Can't delete all border routers from the current network");
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value = Error(ErrorCode ::kIOError, "Failed to delete border routers");
            }
            // Report unresolved aliases
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
        else if (mContext.mDomAliases.size() > 0)
        {
            StringArray undeleted;
            // Remove all border agents in the domain
            auto status = mRegistry->DeleteBorderRoutersInDomain(mContext.mDomAliases[0]);
            if (status == RegistryStatus::kRestricted)
            {
                value =
                    ERROR_REGISTRY_ERROR("Failed to delete border routers in the domain '{}' of the current network",
                                         mContext.mDomAliases[0]);
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value =
                    ERROR_REGISTRY_ERROR("Failed to delete border routers in the domain '{}'", mContext.mDomAliases[0]);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        constexpr const mdns_record_type_t kMdnsQueryType  = MDNS_RECORDTYPE_PTR;
        constexpr const uint32_t           kMdnsBufferSize = 16 * 1024;
        const std::string                  kServiceName    = "_meshcop._udp.local";

        uint32_t                                  scanTimeout = 10000;
        std::string                               netIf       = "";
        int                                       mdnsSocket  = -1;
        FDGuard                                   fdgMdnsSocket;
        std::thread                               selectThread;
        event_base                               *base;
        timeval                                   tvTimeout;
        std::unique_ptr<event, void (*)(event *)> mdnsEvent(nullptr, event_free);
        std::unique_ptr<event, void (*)(event *)> cancelEvent(nullptr, event_free);
        std::vector<BorderAgentOrErrorMsg>        borderAgents;
        nlohmann::json                            baJson;
        char                                      mdnsSendBuffer[kMdnsBufferSize];
        int                                       rval = 0;

        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--timeout");
        if (it != mContext.mCommandKeys.end())
        {
            if (++it != mContext.mCommandKeys.end())
            {
                SuccessOrExit(value = ParseInteger(scanTimeout, it[0]));
            }
            else
            {
                ExitNow(value = ERROR_INVALID_ARGS("Missing --timeout value"));
            }
        }

        it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--netif");
        if (it != mContext.mCommandKeys.end())
        {
            if (++it != mContext.mCommandKeys.end())
            {
                netIf = it[0];
            }
            else
            {
                ExitNow(value = ERROR_INVALID_ARGS("Missing --netif value"));
            }
        }

        // Open IPv4 mDNS socket
        mdnsSocket = mdns_socket_open_ipv4();
        VerifyOrExit(mdnsSocket >= 0, value = ERROR_IO_ERROR("failed to open mDNS IPv4 socket"));

        if (!netIf.empty())
        {
#ifdef __linux__
            rval = setsockopt(mdnsSocket, SOL_SOCKET, SO_BINDTODEVICE, netIf.c_str(), netIf.size());
#else  // __NetBSD__ || __FreeBSD__ || __APPLE__
            rval = setsockopt(mdnsSocket, IPPROTO_IPV6, IP_BOUND_IF, netIf.c_str(), netIf.size());
#endif // __linux__
            VerifyOrExit(rval == 0,
                         value = ERROR_INVALID_ARGS("failed to bind network interface {}: {}", netIf, strerror(errno)));
        }

        fdgMdnsSocket.mFD = mdnsSocket;

        //  Initialize event library
        base = event_base_new();

        // Instantly register timeout event to stop the event loop
        evutil_timerclear(&tvTimeout);
        tvTimeout.tv_sec  = scanTimeout / 1000;
        tvTimeout.tv_usec = (scanTimeout % 1000) * 1000;
        event_base_loopexit(base, &tvTimeout);

        // Register event for inbound events on mdnsSocket
        // The mdnsSocket is already non-blocking (as we need for the event library)
        auto mdnsReaderParser = [](evutil_socket_t aSocket, short aWhat, void *aArg) {
            (void)aWhat;

            BorderAgentOrErrorMsg               agent;
            char                                buf[1024 * 16];
            std::vector<BorderAgentOrErrorMsg> &agents = *static_cast<std::vector<BorderAgentOrErrorMsg> *>(aArg);

            mdns_query_recv(aSocket, buf, sizeof(buf), HandleRecord, &agent, 1);
            agents.push_back(agent);

            return;
        };
        mdnsEvent = std::unique_ptr<event, void (*)(event *)>(
            event_new(base, mdnsSocket, EV_READ | EV_PERSIST, mdnsReaderParser, &borderAgents), event_free);
        event_add(mdnsEvent.get(), nullptr);

        // Stop event queue on data in the mCancelPipe
        auto mdnsCancelEventQueue = [](evutil_socket_t aSocket, short aWhat, void *aArg) {
            (void)aSocket;
            (void)aWhat;
            event_base *ev_base = static_cast<event_base *>(aArg);
            event_base_loopbreak(ev_base);
        };
        // Attach cancel pipe to event loop. When bytes written to the
        // pipe, mdnsCancelEventQueue() lambda is invoked resulting in
        // breaking event loop
        cancelEvent = std::unique_ptr<event, void (*)(event *)>(
            event_new(base, mCancelPipe[0], EV_READ | EV_PERSIST, mdnsCancelEventQueue, base), event_free);
        event_add(cancelEvent.get(), nullptr);

        // Start event loop thread
        selectThread = std::thread([](event_base *aBase) { event_base_dispatch(aBase); }, base);

        // Send mDNS query
        if (mdns_query_send(mdnsSocket, kMdnsQueryType, kServiceName.c_str(), kServiceName.length(), mdnsSendBuffer,
                            sizeof(mdnsSendBuffer)) != 0)
        {
            // Stop event thread
            event_base_loopbreak(base);
            selectThread.join();
            ExitNow(value = ERROR_IO_ERROR("Sending mDNS query failed"));
        }
        // Join the waiting (event loop) thread
        selectThread.join();

        if (mCancelCommand)
        {
            int cancelData;
            while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
                ;
            ExitNow(value = ERROR_CANCELLED("Scan cancelled by user"));
        }

        std::vector<uint64_t> xpans;
        StringArray           unresolved;
        if (!mContext.mNwkAliases.empty())
        {
            VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, xpans, unresolved) ==
                             RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("Failed to convert network aliases to XPAN IDs"));
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(!xpans.empty(),
                         value = ERROR_NOT_FOUND(
                             "No known extended PAN ID discovered for network aliases. Please make complete rescan."));
        }

        // Serialize BorderAgents to JSON into value
        for (const auto &agentOrError : borderAgents)
        {
            if (agentOrError.mError != ErrorCode::kNone)
            {
                Console::Write(agentOrError.mError.GetMessage(), Console::Color::kRed);
            }
            else
            {
                nlohmann::json ba;
                BorderAgentToJson(agentOrError.mBorderAgent, ba);
                if ((mContext.mNwkAliases.empty() && mContext.mDomAliases.empty()) ||
                    (!mContext.mDomAliases.empty() &&
                     (agentOrError.mBorderAgent.mPresentFlags & BorderAgent::kDomainNameBit) &&
                     (agentOrError.mBorderAgent.mDomainName == mContext.mDomAliases[0])) ||
                    (!mContext.mNwkAliases.empty() &&
                     (agentOrError.mBorderAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) &&
                     (std::find(xpans.begin(), xpans.end(), agentOrError.mBorderAgent.mExtendedPanId) != xpans.end())))
                {
                    baJson.push_back(ba);
                }
            }
        }
        value = baJson.dump(JSON_INDENT_DEFAULT);
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}